

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O0

void button_inter_command_do_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object widget;
  Am_Object inter;
  Am_Object parent;
  Am_Value inter_value;
  undefined1 local_30 [8];
  Am_Value new_value;
  Am_Value old_value;
  Am_Object *command_obj_local;
  
  Am_Value::Am_Value((Am_Value *)&new_value.value);
  Am_Value::Am_Value((Am_Value *)local_30);
  Am_Value::Am_Value((Am_Value *)&parent);
  Am_Object::Am_Object(&inter);
  Am_Object::Am_Object(&widget);
  Am_Object::Am_Object(&local_68);
  pAVar2 = Am_Object::Get(command_obj,0x154,0);
  Am_Object::operator=(&inter,pAVar2);
  Am_Object::Get_Owner(&local_70,(Am_Slot_Flags)command_obj);
  Am_Object::operator=(&widget,&local_70);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Get_Owner(&local_78,(Am_Slot_Flags)&widget);
  Am_Object::operator=(&local_68,&local_78);
  Am_Object::~Am_Object(&local_78);
  pAVar2 = Am_Object::Peek(&local_68,0x169,0);
  Am_Value::operator=((Am_Value *)&new_value.value,pAVar2);
  pAVar2 = Am_Object::Peek(&widget,0x169,0);
  Am_Value::operator=((Am_Value *)&parent,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)&parent);
  if (bVar1) {
    pAVar2 = Am_Object::Peek(&local_68,0x1af,0);
    Am_Value::operator=((Am_Value *)local_30,pAVar2);
  }
  else {
    Am_Value::operator=((Am_Value *)local_30,0);
  }
  Am_Object::Set(&local_68,0x169,(Am_Value *)local_30,0);
  Am_Object::Set(command_obj,0x16c,(Am_Value *)&new_value.value,0);
  Am_Object::Set(command_obj,0x169,(Am_Value *)local_30,0);
  bVar1 = Am_Object::Valid(&inter);
  if (bVar1) {
    Am_Object::Set(&inter,0x16c,(Am_Value *)&new_value.value,0);
    Am_Object::Set(&inter,0x169,(Am_Value *)local_30,0);
  }
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&widget);
  Am_Object::~Am_Object(&inter);
  Am_Value::~Am_Value((Am_Value *)&parent);
  Am_Value::~Am_Value((Am_Value *)local_30);
  Am_Value::~Am_Value((Am_Value *)&new_value.value);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, button_inter_command_do,
                 (Am_Object command_obj))
{
  Am_Value old_value, new_value, inter_value;

  // set the widget's and parent's value.
  Am_Object parent, inter, widget;
  parent = command_obj.Get(Am_IMPLEMENTATION_PARENT);
  inter = command_obj.Get_Owner();
  widget = inter.Get_Owner();
  old_value = widget.Peek(Am_VALUE);
  inter_value = inter.Peek(Am_VALUE);
  if (inter_value.Valid())
    new_value = widget.Peek(Am_LABEL_OR_ID);
  else
    new_value = (0L);

  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                       "++ DO method setting the Am_VALUE of "
                           << widget << " to " << new_value);
  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                       "++ DO method setting the Am_VALUE of "
                           << command_obj << " to " << new_value);
  widget.Set(Am_VALUE, new_value);
  command_obj.Set(Am_OLD_VALUE, old_value);
  command_obj.Set(Am_VALUE, new_value);

  if (parent.Valid()) {
    //set old value to current value
    //old_value=parent.Peek(Am_VALUE); // RGM: This is wrong.
    parent.Set(Am_OLD_VALUE, old_value);
    parent.Set(Am_VALUE, new_value);
  }
}